

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderGetParserProp(xmlTextReaderPtr reader,int prop)

{
  xmlParserCtxtPtr pxVar1;
  int iVar2;
  xmlParserProperties p;
  
  iVar2 = -1;
  if ((reader != (xmlTextReaderPtr)0x0) && (pxVar1 = reader->ctxt, pxVar1 != (xmlParserCtxtPtr)0x0))
  {
    switch(prop) {
    case 1:
      iVar2 = 1;
      if (pxVar1->loadsubset == 0) {
        return (int)(pxVar1->validate != 0);
      }
      break;
    case 2:
      return (uint)pxVar1->loadsubset >> 2 & 1;
    case 3:
      return reader->validate;
    case 4:
      iVar2 = pxVar1->replaceEntities;
    }
  }
  return iVar2;
}

Assistant:

int
xmlTextReaderGetParserProp(xmlTextReaderPtr reader, int prop) {
    xmlParserProperties p = (xmlParserProperties) prop;
    xmlParserCtxtPtr ctxt;

    if ((reader == NULL) || (reader->ctxt == NULL))
	return(-1);
    ctxt = reader->ctxt;

    switch (p) {
        case XML_PARSER_LOADDTD:
	    if ((ctxt->loadsubset != 0) || (ctxt->validate != 0))
		return(1);
	    return(0);
        case XML_PARSER_DEFAULTATTRS:
	    if (ctxt->loadsubset & XML_COMPLETE_ATTRS)
		return(1);
	    return(0);
        case XML_PARSER_VALIDATE:
	    return(reader->validate);
	case XML_PARSER_SUBST_ENTITIES:
	    return(ctxt->replaceEntities);
    }
    return(-1);
}